

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KBO.cpp
# Opt level: O1

Result __thiscall Kernel::KBO::compare(KBO *this,AppliedTerm tl1,AppliedTerm tl2)

{
  State *this_00;
  AppliedTerm tl1_00;
  AppliedTerm tt;
  AppliedTerm tt_00;
  AppliedTerm t1;
  AppliedTerm tl2_00;
  AppliedTerm t2;
  TermList TVar1;
  TermList TVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  SubstApplicator *pSVar5;
  TermList TVar6;
  TermList TVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  SubstApplicator *pSVar10;
  bool bVar11;
  Result RVar12;
  
  bVar11 = AppliedTerm::equalsShallow(&tl1,tl2);
  TVar6 = tl2.term;
  TVar1 = tl1.term;
  RVar12 = EQUAL;
  if (!bVar11) {
    if ((tl1.term._content & 1) == 0) {
      if ((tl2.term._content & 1) == 0) {
        this_00 = (this->_state)._M_t.
                  super___uniq_ptr_impl<Kernel::KBO::State,_std::default_delete<Kernel::KBO::State>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Kernel::KBO::State_*,_std::default_delete<Kernel::KBO::State>_>
                  .super__Head_base<0UL,_Kernel::KBO::State_*,_false>._M_head_impl;
        this_00->_weightDiff = 0;
        this_00->_posNum = 0;
        this_00->_negNum = 0;
        this_00->_lexResult = EQUAL;
        ::Lib::DHMap<unsigned_int,_int,_Lib::IdentityHash,_Lib::DefaultHash>::reset
                  (&this_00->_varDiffs);
        pSVar10 = tl2.applicator;
        uVar8 = tl2._8_8_;
        TVar7 = tl2.term;
        pSVar5 = tl1.applicator;
        uVar3 = tl1._8_8_;
        TVar2 = tl1.term;
        if (*(int *)(TVar1._content + 8) == *(int *)(TVar6._content + 8)) {
          tl1_00.aboveVar = tl1.aboveVar;
          tl1_00._9_7_ = tl1._9_7_;
          tl1_00.term._content = tl1.term._content;
          tl1_00.applicator = tl1.applicator;
          tl2_00.aboveVar = tl2.aboveVar;
          tl2_00._9_7_ = tl2._9_7_;
          tl2_00.term._content = tl2.term._content;
          tl2_00.applicator = tl2.applicator;
          RVar12 = State::traverseLexBidir(this_00,this,tl1_00,tl2_00);
        }
        else {
          tt.aboveVar = tl1.aboveVar;
          tt._9_7_ = tl1._9_7_;
          tt.term._content = tl1.term._content;
          tt.applicator = tl1.applicator;
          State::traverse<1,false>(this_00,this,tt);
          uVar4 = tl2._8_8_;
          tl2.aboveVar = SUB81(uVar8,0);
          tl2._9_7_ = SUB87(uVar8,1);
          tt_00.aboveVar = tl2.aboveVar;
          tt_00._9_7_ = tl2._9_7_;
          tt_00.term._content = TVar7._content;
          tt_00.applicator = pSVar10;
          tl2._8_8_ = uVar4;
          State::traverse<_1,false>(this_00,this,tt_00);
          uVar9 = tl2._8_8_;
          uVar4 = tl1._8_8_;
          tl1.aboveVar = SUB81(uVar3,0);
          tl1._9_7_ = SUB87(uVar3,1);
          t1.aboveVar = tl1.aboveVar;
          t1._9_7_ = tl1._9_7_;
          t1.term._content = TVar2._content;
          t1.applicator = pSVar5;
          tl2.aboveVar = SUB81(uVar8,0);
          tl2._9_7_ = SUB87(uVar8,1);
          t2.aboveVar = tl2.aboveVar;
          t2._9_7_ = tl2._9_7_;
          t2.term._content = TVar7._content;
          t2.applicator = pSVar10;
          tl1._8_8_ = uVar4;
          tl2._8_8_ = uVar9;
          RVar12 = State::result(this_00,this,t1,t2);
        }
      }
      else {
        bVar11 = AppliedTerm::containsVar(&tl1,tl2.term);
        RVar12 = (uint)!bVar11 + (uint)!bVar11 * 2 + GREATER;
      }
    }
    else {
      bVar11 = AppliedTerm::containsVar(&tl2,tl1.term);
      RVar12 = (uint)!bVar11 * 2 + LESS;
    }
  }
  return RVar12;
}

Assistant:

Ordering::Result KBO::compare(AppliedTerm tl1, AppliedTerm tl2) const
{
  if(tl1.equalsShallow(tl2)) {
    return EQUAL;
  }
  if(tl1.term.isVar()) {
    return tl2.containsVar(tl1.term) ? LESS : INCOMPARABLE;
  }
  if(tl2.term.isVar()) {
    return tl1.containsVar(tl2.term) ? GREATER : INCOMPARABLE;
  }

  ASS(tl1.term.isTerm());
  ASS(tl2.term.isTerm());

  Term* t1=tl1.term.term();
  Term* t2=tl2.term.term();

  ASS(_state);
  State* state = _state.get();
#if VDEBUG
  //this is to make sure _state isn't used while we're using it
  auto __state = std::move(_state);
#endif

  state->init();
  Result res;
  if(t1->functor()==t2->functor()) {
    res = state->traverseLexBidir(*this, tl1, tl2);
  } else {
    res = state->traverseNonLex</*unidirectional=*/false>(*this, tl1, tl2);
  }
#if VDEBUG
  _state = std::move(__state);
#endif
  return res;
}